

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  ValidateOptions *options;
  string *psVar1;
  WastParseOptions *options_00;
  Script *script;
  OutputBuffer *this;
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var2;
  LexerSourceLineFinder *line_finder;
  string_view filename;
  char *pcVar3;
  Result RVar4;
  char *pcVar5;
  void *data;
  size_t sVar6;
  Callback *callback;
  uint uVar7;
  pointer *unaff_RBX;
  pointer pLVar8;
  pointer *__ptr;
  ulong unaff_RBP;
  pointer *ppLVar9;
  undefined8 unaff_R12;
  pointer *unaff_R13;
  char *unaff_R14;
  pointer unaff_R15;
  string_view filename_00;
  string_view filename_01;
  string_view sVar10;
  string_view source_filename;
  string output_basename;
  Errors errors;
  OptionParser parser;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastParseOptions parse_wast_options;
  
  ppLVar9 = (pointer *)(ulong)(uint)argc;
  __ptr = (pointer *)register0x00000020;
  while( true ) {
    __ptr = __ptr + -1;
    *__ptr = (pointer)unaff_RBP;
    __ptr[-2] = unaff_R15;
    __ptr[-3] = (pointer)unaff_R14;
    __ptr[-4] = (pointer)unaff_R13;
    __ptr[-5] = (pointer)unaff_R12;
    __ptr[-6] = (pointer)unaff_RBX;
    __ptr[-0x30] = (pointer)0x14fbc7;
    wabt::InitStdio();
    __ptr[-0x30] = (pointer)0x14fbe2;
    wabt::OptionParser::OptionParser
              ((OptionParser *)(__ptr + -0x25),"wast2json",
               "  read a file in the wasm spec test format, check it for errors, and\n  convert it to a JSON file and associated wasm binary files.\n\nexamples:\n  # parse spec-test.wast, and write files to spec-test.json. Modules are\n  # written to spec-test.0.wasm, spec-test.1.wasm, etc.\n  $ wast2json spec-test.wast -o spec-test.json\n"
              );
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:64:72)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:64:72)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fc20;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),'v',"verbose","Use multiple times for more info",
               (NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fc36;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:69:20)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:69:20)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fc71;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),"debug-parser",
               "Turn on debugging the parser of wast files",(NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fc87;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x30] = (pointer)0x14fc9b;
    wabt::Features::AddOptions(&s_features,(OptionParser *)(__ptr + -0x25));
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:72:20)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:72:20)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fce0;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),'o',"output","FILE","output JSON file",
               (Callback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fcf6;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:76:7)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:76:7)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fd36;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),'r',"relocatable",
               "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
               (NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fd4c;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:80:7)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:80:7)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fd87;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),"no-canonicalize-leb128s",
               "Write all LEB128 sizes as 5-bytes instead of their minimal size",
               (NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fd9d;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:83:20)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:83:20)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fdd8;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),"debug-names",
               "Write debug names to the generated binary file",(NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fdee;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    __ptr[-0x2f] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:85:20)>
                            ::_M_invoke;
    __ptr[-0x2d] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:85:20)>
                            ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fe29;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x25),"no-check","Don\'t check for invalid modules",
               (NullCallback *)(__ptr + -0x2f));
    if (__ptr[-0x2d] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fe3f;
      (*(code *)__ptr[-0x2d])(__ptr + -0x2f,__ptr + -0x2f,3);
    }
    unaff_R13 = __ptr + -0x2d;
    __ptr[-0x2f] = (pointer)unaff_R13;
    *unaff_R13 = (pointer)0x656d616e656c6966;
    __ptr[-0x2e] = (pointer)0x8;
    *(undefined1 *)(__ptr + -0x2c) = 0;
    callback = (Callback *)(__ptr + -0xf);
    *(undefined8 *)&(callback->super__Function_base)._M_functor = 0;
    __ptr[-0xe] = (pointer)0x0;
    __ptr[-0xc] = (pointer)std::
                           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:87:22)>
                           ::_M_invoke;
    __ptr[-0xd] = (pointer)std::
                           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wast2json.cc:87:22)>
                           ::_M_manager;
    __ptr[-0x30] = (pointer)0x14fe9a;
    wabt::OptionParser::AddArgument
              ((OptionParser *)(__ptr + -0x25),(string *)(__ptr + -0x2f),One,callback);
    if (__ptr[-0xd] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14feb5;
      (*(code *)__ptr[-0xd])(__ptr + -0xf,__ptr + -0xf,3);
    }
    if (__ptr[-0x2f] != (pointer)unaff_R13) {
      __ptr[-0x30] = (pointer)0x14fec3;
      operator_delete(__ptr[-0x2f]);
    }
    __ptr[-0x30] = (pointer)0x14fed5;
    wabt::OptionParser::Parse((OptionParser *)(__ptr + -0x25),(int)ppLVar9,argv);
    if (__ptr[-0x15] != (pointer)0x0) {
      __ptr[-0x30] = (pointer)0x14fef3;
      (*(code *)__ptr[-0x15])(__ptr + -0x17,__ptr + -0x17,3);
    }
    __ptr[-0x30] = (pointer)0x14ff00;
    std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
    ~vector((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
            (__ptr + -0x1a));
    __ptr[-0x30] = (pointer)0x14ff10;
    std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
              ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
               (__ptr + -0x1d));
    if (__ptr[-0x21] != (pointer)(__ptr + -0x1f)) {
      __ptr[-0x30] = (pointer)0x14ff26;
      operator_delete(__ptr[-0x21]);
    }
    unaff_R15 = (pointer)(__ptr + -0x23);
    if (__ptr[-0x25] != unaff_R15) {
      __ptr[-0x30] = (pointer)0x14ff39;
      operator_delete(__ptr[-0x25]);
    }
    pcVar3 = s_infile;
    unaff_RBX = __ptr + -0xf;
    *unaff_RBX = (pointer)0x0;
    __ptr[-0xe] = (pointer)0x0;
    __ptr[-0xd] = (pointer)0x0;
    __ptr[-0x30] = (pointer)0x14ff5e;
    pcVar5 = (char *)strlen(s_infile);
    __ptr[-0x30] = (pointer)0x14ff6c;
    sVar10.size_ = (size_type)unaff_RBX;
    sVar10.data_ = pcVar5;
    RVar4 = wabt::ReadFile((wabt *)pcVar3,sVar10,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    unaff_R14 = s_infile;
    unaff_RBP = (ulong)RVar4.enum_;
    __ptr[-0x30] = (pointer)0x14ff7d;
    data = (void *)strlen(s_infile);
    ppLVar9 = __ptr + -0x2b;
    __ptr[-0x30] = (pointer)0x14ff97;
    filename_01.size_ = (size_type)unaff_R14;
    filename_01.data_ = (char *)ppLVar9;
    argv = (char **)unaff_R14;
    wabt::WastLexer::CreateBufferLexer(filename_01,data,(size_t)*unaff_RBX);
    if (RVar4.enum_ != Error) break;
    __ptr[-0x30] = (pointer)main;
    ProgramMain();
    __ptr = __ptr + -0x2f;
  }
  (((Errors *)(__ptr + -0x29))->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __ptr[-0x28] = (pointer)0x0;
  __ptr[-0x27] = (pointer)0x0;
  (((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)(__ptr + -0x2a))->_M_t).
  super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl = (Script *)0x0;
  options_00 = (WastParseOptions *)(__ptr + -10);
  *(undefined4 *)(__ptr + -9) = s_features._8_4_;
  (options_00->features).exceptions_enabled_ = s_features.exceptions_enabled_;
  (options_00->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  (options_00->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  (options_00->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
  (options_00->features).simd_enabled_ = s_features.simd_enabled_;
  (options_00->features).threads_enabled_ = s_features.threads_enabled_;
  (options_00->features).multi_value_enabled_ = s_features.multi_value_enabled_;
  (options_00->features).tail_call_enabled_ = s_features.tail_call_enabled_;
  *(undefined1 *)((long)__ptr + -0x44) = 0;
  __ptr[-0x30] = (pointer)0x14ffe2;
  RVar4 = wabt::ParseWastScript
                    ((WastLexer *)__ptr[-0x2b],
                     (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)(__ptr + -0x2a)
                     ,(Errors *)(__ptr + -0x29),options_00);
  uVar7 = 1;
  if (RVar4.enum_ == Ok) {
    if (s_validate == '\0') {
      options = (ValidateOptions *)(__ptr + -0x25);
      *(undefined4 *)(__ptr + -0x24) = s_features._8_4_;
      (options->features).exceptions_enabled_ = s_features.exceptions_enabled_;
      (options->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      (options->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      (options->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
      (options->features).simd_enabled_ = s_features.simd_enabled_;
      (options->features).threads_enabled_ = s_features.threads_enabled_;
      (options->features).multi_value_enabled_ = s_features.multi_value_enabled_;
      (options->features).tail_call_enabled_ = s_features.tail_call_enabled_;
      __ptr[-0x30] = (pointer)0x15001f;
      RVar4 = wabt::ValidateScript((Script *)__ptr[-0x2a],(Errors *)(__ptr + -0x29),options);
      if (RVar4.enum_ != Ok) goto LAB_001501e5;
    }
    if (s_outfile_abi_cxx11_._M_string_length == 0) {
      __ptr[-0x30] = (pointer)0x150040;
      strlen(s_infile);
      __ptr[-0x30] = (pointer)0x15004b;
      wabt::GetBasename(*(string_view *)(__ptr + -0x2f));
      __ptr[-0x30] = (pointer)0x150056;
      sVar10 = wabt::StripExtension(*(string_view *)(__ptr + -0x30));
      *(string_view *)(__ptr + -0x2f) = sVar10;
      psVar1 = (string *)(__ptr + -0x25);
      __ptr[-0x30] = (pointer)0x15006d;
      wabt::string_view::operator_cast_to_string(psVar1,(string_view *)(__ptr + -0x2f));
      __ptr[-0x30] = (pointer)0x15007c;
      std::__cxx11::string::append((char *)psVar1);
      __ptr[-0x30] = (pointer)0x15008b;
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)psVar1);
      pLVar8 = (pointer)(psVar1->_M_dataplus)._M_p;
      if (pLVar8 != unaff_R15) {
        __ptr[-0x30] = (pointer)0x150098;
        operator_delete(pLVar8);
      }
    }
    ppLVar9 = __ptr + -0x13;
    *ppLVar9 = (pointer)0x0;
    __ptr[-0x12] = (pointer)0x0;
    __ptr[-0x11] = (pointer)0x0;
    __ptr[-0x30] = (pointer)0x1500be;
    wabt::MemoryStream::MemoryStream((MemoryStream *)(__ptr + -0x25),(Stream *)0x0);
    __ptr[-0x30] = (pointer)0x1500d1;
    sVar10 = wabt::StripExtension(*(string_view *)(__ptr + -0x30));
    *(string_view *)(__ptr + -8) = sVar10;
    __ptr[-0x30] = (pointer)0x1500eb;
    wabt::string_view::to_string_abi_cxx11_((string *)(__ptr + -0x2f),(string_view *)(__ptr + -8));
    pcVar3 = s_infile;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    script = (Script *)__ptr[-0x2a];
    __ptr[-0x30] = (pointer)0x150119;
    sVar6 = strlen(s_infile);
    sVar10 = *(string_view *)(__ptr + -0x2f);
    ((__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true> *)
    (__ptr + -0x31))->
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_> =
         (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    __ptr[-0x32] = (pointer)ppLVar9;
    __ptr[-0x33] = (pointer)&s_write_binary_options;
    __ptr[-0x34] = (pointer)0x150144;
    source_filename.size_ = sVar6;
    source_filename.data_ = pcVar3;
    RVar4 = wabt::WriteBinarySpecScript
                      ((Stream *)(__ptr + -0x25),script,source_filename,sVar10,
                       (WriteBinaryOptions *)__ptr[-0x33],
                       (vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                        *)__ptr[-0x32],(Stream *)__ptr[-0x31]);
    __ptr[-0x30] = (pointer)0x150162;
    filename_00.size_ = s_outfile_abi_cxx11_._M_string_length;
    filename_00.data_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
    wabt::OutputBuffer::WriteToFile((OutputBuffer *)__ptr[-0x21],filename_00);
    pLVar8 = *ppLVar9;
    if (pLVar8 != __ptr[-0x12]) {
      do {
        filename.data_ = *(char **)&pLVar8->source_;
        filename.size_ =
             (size_type)
             (pLVar8->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        this = *(OutputBuffer **)(pLVar8->next_line_start_ + 0x20);
        __ptr[-0x30] = (pointer)0x150180;
        wabt::OutputBuffer::WriteToFile(this,filename);
        pLVar8 = (pointer)&pLVar8->last_cr_;
      } while (pLVar8 != __ptr[-0x12]);
    }
    if (__ptr[-0x2f] != (pointer)unaff_R13) {
      __ptr[-0x30] = (pointer)0x15019c;
      operator_delete(__ptr[-0x2f]);
    }
    __ptr[-0x25] = (pointer)&PTR__MemoryStream_001bb7f0;
    pLVar8 = __ptr[-0x21];
    if (pLVar8 != (pointer)0x0) {
      _Var2._M_head_impl =
           (pLVar8->source_)._M_t.
           super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
           super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
           super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (LexerSource *)0x0) {
        __ptr[-0x30] = (pointer)0x1501c8;
        operator_delete(_Var2._M_head_impl);
      }
      __ptr[-0x30] = (pointer)0x1501d0;
      operator_delete(pLVar8);
    }
    __ptr[-0x30] = (pointer)0x1501dd;
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
             *)(__ptr + -0x13));
    uVar7 = (uint)(RVar4.enum_ != Ok);
  }
LAB_001501e5:
  __ptr[-0x30] = (pointer)0x1501f5;
  wabt::WastLexer::MakeLineFinder((WastLexer *)(__ptr + -0x2f));
  line_finder = __ptr[-0x2f];
  psVar1 = (string *)(__ptr + -0x25);
  (psVar1->_M_dataplus)._M_p = (pointer)(__ptr + -0x23);
  __ptr[-0x24] = (pointer)0x0;
  *(undefined1 *)(__ptr + -0x23) = 0;
  __ptr[-0x31] = (pointer)0x50;
  __ptr[-0x32] = (pointer)0x15022f;
  wabt::FormatErrorsToFile
            ((Errors *)(__ptr + -0x29),Text,line_finder,_stderr,psVar1,Never,*(int *)(__ptr + -0x31)
            );
  ppLVar9 = (pointer *)(psVar1->_M_dataplus)._M_p;
  if (ppLVar9 != __ptr + -0x23) {
    __ptr[-0x30] = (pointer)0x150240;
    operator_delete(ppLVar9);
  }
  if (__ptr[-0x2f] != (LexerSourceLineFinder *)0x0) {
    __ptr[-0x30] = (pointer)0x150251;
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)(__ptr + -0x2f),__ptr[-0x2f]);
  }
  pLVar8 = __ptr[-0x2a];
  if (pLVar8 != (pointer)0x0) {
    __ptr[-0x30] = (pointer)0x150264;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   *)&(pLVar8->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __ptr[-0x30] = (pointer)0x15026c;
    std::
    vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
    ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               *)pLVar8);
    __ptr[-0x30] = (pointer)0x150274;
    operator_delete(pLVar8);
  }
  __ptr[-0x30] = (pointer)0x15027e;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)(__ptr + -0x29));
  if ((WastLexer *)__ptr[-0x2b] != (WastLexer *)0x0) {
    __ptr[-0x30] = (pointer)0x150292;
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)(__ptr + -0x2b),(WastLexer *)__ptr[-0x2b]);
  }
  if (__ptr[-0xf] != (pointer)0x0) {
    __ptr[-0x30] = (pointer)0x1502a4;
    operator_delete(__ptr[-0xf]);
  }
  return uVar7;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename = StripExtension(s_outfile).to_string();
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    json_stream.WriteToFile(s_outfile);

    for (auto iter = module_streams.begin(); iter != module_streams.end();
         ++iter) {
      iter->stream->WriteToFile(iter->filename);
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}